

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O2

void __thiscall embree::XMLWriter::store(XMLWriter *this,AmbientLight *light,ssize_t id)

{
  int __oflag;
  allocator local_51;
  string local_50 [32];
  string local_30 [32];
  
  std::__cxx11::string::string(local_30,"AmbientLight",&local_51);
  open(this,(char *)local_30,__oflag);
  std::__cxx11::string::~string(local_30);
  store(this,"L",&light->L);
  std::__cxx11::string::string(local_50,"AmbientLight",&local_51);
  close(this,(int)local_50);
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

void XMLWriter::store(const SceneGraph::AmbientLight& light, ssize_t id)
  {
    open("AmbientLight");
    store("L",light.L);
    close("AmbientLight");
  }